

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveFile::Encode(CDirectiveFile *this)

{
  CDirectiveFile *this_local;
  
  if (this->type < Close) {
    FileManager::openFile(g_fileManager,&this->file->super_AssemblerFile,false);
  }
  else if (this->type == Close) {
    FileManager::closeFile(g_fileManager);
  }
  return;
}

Assistant:

void CDirectiveFile::Encode()
{
	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		g_fileManager->openFile(file,false);
		break;
	case Type::Close:
		g_fileManager->closeFile();
		break;
	}
}